

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,with_statement *s)

{
  std::operator<<(this->os_,"with (");
  accept<mjs::print_visitor>
            ((s->e_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  std::operator<<(this->os_,") ");
  accept<mjs::print_visitor>
            ((s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
  return;
}

Assistant:

void operator()(const with_statement& s) {
        os_ << "with (";
        accept(s.e(), *this);
        os_ << ") ";
        accept(s.s(), *this);
    }